

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthreads_summator_lib.cpp
# Opt level: O1

void * thread(void *thread_data)

{
  char cVar1;
  ostream *poVar2;
  undefined8 uVar3;
  int num;
  ifstream in;
  stringstream ss;
  undefined1 *local_3c8;
  undefined8 local_3c0;
  undefined1 local_3b8;
  undefined7 uStack_3b7;
  long local_3a8 [4];
  byte abStack_388 [488];
  stringstream local_1a0 [16];
  ostream local_190 [8];
  string local_188 [104];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"..\\Files\\",9);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,*thread_data);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".txt",4);
  std::__cxx11::stringbuf::str();
  std::ifstream::ifstream(local_3a8,(string *)&local_3c8,_S_in);
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,CONCAT71(uStack_3b7,local_3b8) + 1);
  }
  local_3c0 = 0;
  local_3b8 = 0;
  local_3c8 = &local_3b8;
  std::__cxx11::stringbuf::str(local_188);
  if (local_3c8 != &local_3b8) {
    operator_delete(local_3c8,CONCAT71(uStack_3b7,local_3b8) + 1);
  }
  cVar1 = std::__basic_file<char>::is_open();
  if ((cVar1 != '\0') && ((abStack_388[*(long *)(local_3a8[0] + -0x18)] & 2) == 0)) {
    do {
      std::istream::operator>>((istream *)local_3a8,(int *)&local_3c8);
      *(long *)((long)thread_data + 8) = *(long *)((long)thread_data + 8) + (long)(int)local_3c8;
    } while ((abStack_388[*(long *)(local_3a8[0] + -0x18)] & 2) == 0);
  }
  uVar3 = std::ifstream::close();
  std::ifstream::~ifstream(local_3a8);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  _Unwind_Resume(uVar3);
}

Assistant:

void* thread(void *thread_data) {
    stringstream ss;
    thr_data *data = (thr_data*) thread_data;

    ss << "..\\Files\\" << data->numberFile << ".txt";
    ifstream in(ss.str());
    ss.str(string());
    if (in.is_open()) {
        while (!in.eof()) {
            int num;
            in >> num;
            data->sum += num;
        }
    }
    in.close();
}